

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_set.cpp
# Opt level: O1

void __thiscall
SetFixture_InsertInternalStore_Test::~SetFixture_InsertInternalStore_Test
          (SetFixture_InsertInternalStore_Test *this)

{
  (this->super_SetFixture).super_Test._vptr_Test = (_func_int **)&PTR__SetFixture_002746a8;
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~hamt_map(&(this->super_SetFixture).index_.map_);
  pstore::database::~database(&(this->super_SetFixture).db_);
  in_memory_store::~in_memory_store(&(this->super_SetFixture).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_F (SetFixture, InsertInternalStore) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    std::pair<iterator, bool> itp1 = index_.insert (t1, "a"s);
    std::pair<iterator, bool> itp2 = index_.insert (t1, "b"s);

    std::string const & key1 = (*itp1.first);
    EXPECT_EQ ("a", key1);
    EXPECT_TRUE (itp1.second);
    std::string const & key2 = (*itp2.first);
    EXPECT_EQ ("b", key2);
    EXPECT_TRUE (itp2.second);
    index_.flush (t1, db_.get_current_revision ());

    std::pair<iterator, bool> itp3 = index_.insert (t1, "a"s);
    EXPECT_FALSE (itp3.second);
}